

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close-accept.c
# Opt level: O3

int run_test_tcp_close_accept(void)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  code *pcVar4;
  ulong uVar5;
  undefined8 *extraout_RDX;
  uint uVar6;
  char cVar7;
  bool bVar8;
  undefined8 unaff_RBP;
  uv_loop_t *puVar9;
  uv_loop_t *puVar10;
  uv_tcp_t *puVar11;
  int iVar12;
  long lVar13;
  sockaddr_in *unaff_R14;
  code *unaff_R15;
  undefined1 auStack_78 [16];
  uv_loop_t *puStack_68;
  uv_loop_t *puStack_58;
  sockaddr_in *psStack_50;
  code *pcStack_48;
  code *pcStack_40;
  
  pcStack_40 = (code *)0x17e31c;
  pcVar4 = (code *)uv_default_loop();
  puVar11 = (uv_tcp_t *)0x1a4e6a;
  iVar3 = 0x23a3;
  pcStack_40 = (code *)0x17e337;
  iVar2 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
  if (iVar2 == 0) {
    iVar3 = 0x333920;
    pcStack_40 = (code *)0x17e34e;
    puVar11 = (uv_tcp_t *)pcVar4;
    iVar2 = uv_tcp_init();
    if (iVar2 != 0) goto LAB_0017e496;
    puVar11 = &tcp_server;
    iVar3 = 0x333910;
    pcStack_40 = (code *)0x17e36b;
    iVar2 = uv_tcp_bind(&tcp_server,&addr,0);
    if (iVar2 != 0) goto LAB_0017e49b;
    puVar11 = &tcp_server;
    iVar3 = 2;
    pcStack_40 = (code *)0x17e38b;
    iVar2 = uv_listen(&tcp_server,2,connection_cb);
    if (iVar2 != 0) goto LAB_0017e4a0;
    unaff_RBP = CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
    lVar13 = 0;
    unaff_R14 = &addr;
    unaff_R15 = connect_cb;
    do {
      iVar12 = (int)(tcp_outgoing + lVar13);
      pcStack_40 = (code *)0x17e3c3;
      puVar11 = (uv_tcp_t *)pcVar4;
      iVar3 = iVar12;
      iVar2 = uv_tcp_init();
      if (iVar2 != 0) {
LAB_0017e48c:
        pcStack_40 = (code *)0x17e491;
        run_test_tcp_close_accept_cold_5();
        goto LAB_0017e491;
      }
      puVar11 = (uv_tcp_t *)(connect_reqs + lVar13);
      pcStack_40 = (code *)0x17e3f2;
      iVar3 = iVar12;
      iVar2 = uv_tcp_connect(puVar11,tcp_outgoing + lVar13,&addr,connect_cb);
      if (iVar2 != 0) {
        pcStack_40 = (code *)0x17e48c;
        run_test_tcp_close_accept_cold_6();
        goto LAB_0017e48c;
      }
      lVar13 = 1;
      cVar7 = (char)unaff_RBP;
      unaff_RBP = 0;
    } while (cVar7 != '\0');
    iVar3 = 0;
    pcStack_40 = (code *)0x17e415;
    puVar11 = (uv_tcp_t *)pcVar4;
    uv_run();
    if (got_connections != 2) goto LAB_0017e4a5;
    if (close_cb_called != 4) goto LAB_0017e4aa;
    if (write_cb_called != 2) goto LAB_0017e4af;
    if (read_cb_called != 1) goto LAB_0017e4b4;
    pcStack_40 = (code *)0x17e442;
    pcVar4 = (code *)uv_default_loop();
    pcStack_40 = (code *)0x17e456;
    uv_walk(pcVar4,close_walk_cb,0);
    iVar3 = 0;
    pcStack_40 = (code *)0x17e460;
    uv_run(pcVar4);
    pcStack_40 = (code *)0x17e465;
    puVar11 = (uv_tcp_t *)uv_default_loop();
    pcStack_40 = (code *)0x17e46d;
    iVar2 = uv_loop_close();
    if (iVar2 == 0) {
      pcStack_40 = (code *)0x17e476;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
LAB_0017e491:
    pcStack_40 = (code *)0x17e496;
    run_test_tcp_close_accept_cold_1();
LAB_0017e496:
    pcStack_40 = (code *)0x17e49b;
    run_test_tcp_close_accept_cold_2();
LAB_0017e49b:
    pcStack_40 = (code *)0x17e4a0;
    run_test_tcp_close_accept_cold_3();
LAB_0017e4a0:
    pcStack_40 = (code *)0x17e4a5;
    run_test_tcp_close_accept_cold_4();
LAB_0017e4a5:
    pcStack_40 = (code *)0x17e4aa;
    run_test_tcp_close_accept_cold_7();
LAB_0017e4aa:
    pcStack_40 = (code *)0x17e4af;
    run_test_tcp_close_accept_cold_8();
LAB_0017e4af:
    pcStack_40 = (code *)0x17e4b4;
    run_test_tcp_close_accept_cold_9();
LAB_0017e4b4:
    pcStack_40 = (code *)0x17e4b9;
    run_test_tcp_close_accept_cold_10();
  }
  pcStack_40 = connection_cb;
  run_test_tcp_close_accept_cold_11();
  puStack_58 = (uv_loop_t *)pcVar4;
  psStack_50 = unaff_R14;
  pcStack_48 = unaff_R15;
  pcStack_40 = (code *)unaff_RBP;
  if (puVar11 == &tcp_server) {
    uVar5 = (ulong)got_connections;
    if (uVar5 == 2) {
LAB_0017e56a:
      return (int)uVar5;
    }
    got_connections = got_connections + 1;
    puVar10 = (uv_loop_t *)(tcp_incoming + uVar5);
    puStack_68 = (uv_loop_t *)0x17e50e;
    puVar9 = puVar10;
    puVar11 = (uv_tcp_t *)tcp_server.loop;
    iVar2 = uv_tcp_init();
    iVar3 = (int)puVar9;
    pcVar4 = (code *)puVar10;
    if (iVar2 != 0) goto LAB_0017e57f;
    puVar11 = &tcp_server;
    puStack_68 = (uv_loop_t *)0x17e521;
    uVar5 = uv_accept();
    iVar3 = (int)puVar10;
    if ((int)uVar5 == 0) {
      if (got_connections == 2) {
        uVar5 = 0;
        pcVar4 = alloc_cb;
        bVar1 = true;
        do {
          bVar8 = bVar1;
          puVar11 = tcp_incoming + uVar5;
          iVar3 = 0x17e686;
          puStack_68 = (uv_loop_t *)0x17e556;
          iVar2 = uv_read_start(puVar11,alloc_cb,read_cb);
          if (iVar2 != 0) {
            puStack_68 = (uv_loop_t *)0x17e57a;
            connection_cb_cold_4();
            goto LAB_0017e57a;
          }
          uVar5 = 1;
          bVar1 = false;
        } while (bVar8);
      }
      goto LAB_0017e56a;
    }
  }
  else {
LAB_0017e57a:
    puStack_68 = (uv_loop_t *)0x17e57f;
    connection_cb_cold_1();
LAB_0017e57f:
    puStack_68 = (uv_loop_t *)0x17e584;
    connection_cb_cold_2();
  }
  puStack_68 = (uv_loop_t *)connect_cb;
  connection_cb_cold_3();
  puStack_68 = (uv_loop_t *)pcVar4;
  if (puVar11 == (uv_tcp_t *)&tcp_check_req) {
    if (iVar3 != 0) {
      uv_close(tcp_incoming + pending_incoming,close_cb);
      iVar3 = uv_close(&tcp_check,close_cb);
      return iVar3;
    }
    goto LAB_0017e681;
  }
  if (iVar3 == 0) {
    if (puVar11 < connect_reqs) goto LAB_0017e672;
    if (&got_connections < puVar11) goto LAB_0017e677;
    uVar6 = (int)((ulong)((uv_loop_t *)((long)puVar11 + -0x333d80))->process_handles >> 5) *
            -0x55555555;
    auStack_78 = uv_buf_init("x",1);
    iVar3 = uv_write(write_reqs + uVar6,tcp_outgoing + uVar6,auStack_78,1,write_cb);
    if (iVar3 == 0) {
      return 0;
    }
  }
  else {
    connect_cb_cold_1();
LAB_0017e672:
    connect_cb_cold_4();
LAB_0017e677:
    connect_cb_cold_3();
  }
  connect_cb_cold_2();
LAB_0017e681:
  connect_cb_cold_5();
  *extraout_RDX = alloc_cb::slab;
  extraout_RDX[1] = 1;
  return 0x333ed0;
}

Assistant:

TEST_IMPL(tcp_close_accept) {
  unsigned int i;
  uv_loop_t* loop;
  uv_tcp_t* client;

  /*
   * A little explanation of what goes on below:
   *
   * We'll create server and connect to it using two clients, each writing one
   * byte once connected.
   *
   * When all clients will be accepted by server - we'll start reading from them
   * and, on first client's first byte, will close second client and server.
   * After that, we'll immediately initiate new connection to server using
   * tcp_check handle (thus, reusing fd from second client).
   *
   * In this situation uv__io_poll()'s event list should still contain read
   * event for second client, and, if not cleaned up properly, `tcp_check` will
   * receive stale event of second incoming and invoke `connect_cb` with zero
   * status.
   */

  loop = uv_default_loop();
  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  ASSERT(0 == uv_tcp_init(loop, &tcp_server));
  ASSERT(0 == uv_tcp_bind(&tcp_server, (const struct sockaddr*) &addr, 0));
  ASSERT(0 == uv_listen((uv_stream_t*) &tcp_server,
                        ARRAY_SIZE(tcp_outgoing),
                        connection_cb));

  for (i = 0; i < ARRAY_SIZE(tcp_outgoing); i++) {
    client = tcp_outgoing + i;

    ASSERT(0 == uv_tcp_init(loop, client));
    ASSERT(0 == uv_tcp_connect(&connect_reqs[i],
                               client,
                               (const struct sockaddr*) &addr,
                               connect_cb));
  }

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT(ARRAY_SIZE(tcp_outgoing) == got_connections);
  ASSERT((ARRAY_SIZE(tcp_outgoing) + 2) == close_cb_called);
  ASSERT(ARRAY_SIZE(tcp_outgoing) == write_cb_called);
  ASSERT(1 == read_cb_called);

  MAKE_VALGRIND_HAPPY();
  return 0;
}